

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (lVar1 != 0) {
    if (*(code **)(lVar1 + 0x48) != (code *)0x0) {
      (**(code **)(lVar1 + 0x48))();
      if ((((*(long *)((long)ctx + 0x50) != 0) && (*(long *)((long)ctx + 0x38) != 0)) &&
          (pcVar2 = *(char **)(*(long *)((long)ctx + 0x38) + 0x20), pcVar2 != (char *)0x0)) &&
         ((*pcVar2 == '/' && (pcVar2[1] == '>')))) {
        *(undefined2 *)(*(long *)((long)ctx + 0x50) + 0x72) = 1;
      }
    }
    *(undefined4 *)(lVar1 + 0x18) = 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderStartElementNs(void *ctx,
                      const xmlChar *localname,
		      const xmlChar *prefix,
		      const xmlChar *URI,
		      int nb_namespaces,
		      const xmlChar **namespaces,
		      int nb_attributes,
		      int nb_defaulted,
		      const xmlChar **attributes)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

    if ((reader != NULL) && (reader->startElementNs != NULL)) {
	reader->startElementNs(ctx, localname, prefix, URI, nb_namespaces,
	                       namespaces, nb_attributes, nb_defaulted,
			       attributes);
	if ((ctxt->node != NULL) && (ctxt->input != NULL) &&
	    (ctxt->input->cur != NULL) && (ctxt->input->cur[0] == '/') &&
	    (ctxt->input->cur[1] == '>'))
	    ctxt->node->extra = NODE_IS_EMPTY;
    }
    if (reader != NULL)
	reader->state = XML_TEXTREADER_ELEMENT;
}